

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O0

void __thiscall QtMWidgets::BlurEffect::drawBlur(BlurEffect *this,QPainter *p,QColor *c)

{
  int iVar1;
  int iVar2;
  double *pdVar3;
  int local_ac;
  int local_a4;
  int local_98;
  int local_8c;
  QBrush local_70 [8];
  undefined1 local_68 [8];
  QRect dark;
  QColor c1;
  double local_40;
  double local_38;
  qreal realPressure;
  QRect r;
  QColor *c_local;
  QPainter *p_local;
  BlurEffect *this_local;
  
  r._8_8_ = c;
  _realPressure = QWidget::rect(&this->super_QWidget);
  iVar1 = qAbs<int>(&this->pressure);
  local_40 = (double)iVar1 / this->maxPressure;
  c1._8_8_ = 0x3ff0000000000000;
  pdVar3 = qMin<double>(&local_40,(double *)((long)&c1.ct + 4));
  local_38 = *pdVar3;
  dark._8_8_ = *(undefined8 *)r._8_8_;
  c1._0_8_ = *(undefined8 *)(r._8_8_ + 8);
  QColor::setAlpha((int)&dark + 8);
  if (this->orientation == Vertical) {
    iVar1 = QRect::x((QRect *)&realPressure);
    iVar2 = QRect::width((QRect *)&realPressure);
    local_8c = iVar1 + iVar2 / 2 + -2;
  }
  else {
    local_8c = QRect::x((QRect *)&realPressure);
  }
  if (this->orientation == Horizontal) {
    iVar1 = QRect::y((QRect *)&realPressure);
    iVar2 = QRect::height((QRect *)&realPressure);
    local_98 = iVar1 + iVar2 / 2 + -2;
  }
  else {
    local_98 = QRect::y((QRect *)&realPressure);
  }
  if (this->orientation == Vertical) {
    local_a4 = 4;
  }
  else {
    local_a4 = QRect::width((QRect *)&realPressure);
  }
  if (this->orientation == Horizontal) {
    local_ac = 4;
  }
  else {
    local_ac = QRect::height((QRect *)&realPressure);
  }
  QRect::QRect((QRect *)local_68,local_8c,local_98,local_a4,local_ac);
  QPainter::setPen((PenStyle)p);
  QBrush::QBrush(local_70,(QColor *)&dark.x2,SolidPattern);
  QPainter::setBrush((QBrush *)p);
  QBrush::~QBrush(local_70);
  QPainter::drawEllipse((QRect *)p);
  return;
}

Assistant:

void
BlurEffect::drawBlur( QPainter * p, const QColor & c )
{
	const QRect r = rect();

	const qreal realPressure = qMin(
		(qreal) qAbs( pressure ) / maxPressure, 1.0 );

	QColor c1 = c;
	c1.setAlpha( 255 * realPressure );

	const QRect dark(
		( orientation == Qt::Vertical ? r.x() + r.width() / 2 - 2 : r.x() ),
		( orientation == Qt::Horizontal ? r.y() + r.height() / 2 - 2 : r.y() ),
		( orientation == Qt::Vertical ? 4 : r.width() ),
		( orientation == Qt::Horizontal ? 4 : r.height() ) );

	p->setPen( Qt::NoPen );
	p->setBrush( c1 );
	p->drawEllipse( dark );
}